

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O2

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findCandidates
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          CartesianSpeakerPosition *pos,bool isLfe,double tol)

{
  MatrixXd *xpr;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  reference_const_type pdVar7;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  long index;
  long lVar11;
  RowVector3d cartPosition;
  undefined1 local_2e8 [72];
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_2a0;
  Channel channel;
  DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
  local_1d8 [56];
  DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
  local_1a0 [56];
  DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
  local_168 [56];
  DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
  local_130 [56];
  CartesianSpeakerPosition local_f8;
  
  CartesianSpeakerPosition::CartesianSpeakerPosition(&local_f8,pos);
  toCartesianVector3d(&local_f8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>
            ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&cartPosition,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&channel);
  ScreenEdgeLock::~ScreenEdgeLock(&local_f8.screenEdgeLock);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar7 = boost::optional<double>::get_value_or(&pos->XMin,&pos->X);
  dVar1 = *pdVar7;
  pdVar7 = boost::optional<double>::get_value_or(&pos->XMax,&pos->X);
  dVar2 = *pdVar7;
  pdVar7 = boost::optional<double>::get_value_or(&pos->YMin,&pos->Y);
  dVar3 = *pdVar7;
  pdVar7 = boost::optional<double>::get_value_or(&pos->YMax,&pos->Y);
  dVar4 = *pdVar7;
  pdVar7 = boost::optional<double>::get_value_or(&pos->ZMin,&pos->Z);
  dVar5 = *pdVar7;
  pdVar7 = boost::optional<double>::get_value_or(&pos->ZMax,&pos->Z);
  dVar6 = *pdVar7;
  xpr = &this->_positions;
  lVar11 = 0;
  for (index = 0; index < this->_nChannels; index = index + 1) {
    pvVar8 = Layout::channels(&this->_layout);
    Channel::Channel(&channel,(Channel *)
                              ((long)&(((pvVar8->
                                        super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_name).
                                      _M_dataplus._M_p + lVar11));
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<bool,__1,_1,_0,__1,_1>,_1> *)&this->_isLfe,
                        index);
    if (*pSVar9 == isLfe) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2e8,xpr,
                 index);
      pSVar10 = Eigen::
                DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                              *)local_2e8,0);
      if (dVar1 <= *pSVar10 + tol) {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  (&local_2a0,xpr,index);
        pSVar10 = Eigen::
                  DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                                *)&local_2a0,0);
        if (*pSVar10 - tol <= dVar2) {
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_130,xpr,
                     index);
          pSVar10 = Eigen::
                    DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                    ::operator()(local_130,1);
          if (dVar3 <= *pSVar10 + tol) {
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_168,
                       xpr,index);
            pSVar10 = Eigen::
                      DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                      ::operator()(local_168,1);
            if (*pSVar10 - tol <= dVar4) {
              Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a0,
                         xpr,index);
              pSVar10 = Eigen::
                        DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                        ::operator()(local_1a0,2);
              if (dVar5 <= *pSVar10 + tol) {
                Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                          ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                           local_1d8,xpr,index);
                pSVar10 = Eigen::
                          DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_1>
                          ::operator()(local_1d8,2);
                if (*pSVar10 - tol <= dVar6) {
                  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                            (&local_2a0,xpr,index);
                  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::
                  operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                             *)local_2e8,
                            (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                             *)&local_2a0,
                            (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&cartPosition);
                  local_2e8._8_8_ =
                       Eigen::
                       MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                               *)local_2e8);
                  local_2e8._0_4_ = (undefined4)index;
                  std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
                  emplace_back<std::pair<int,double>>
                            ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                             __return_storage_ptr__,(pair<int,_double> *)local_2e8);
                }
              }
            }
          }
        }
      }
    }
    Channel::~Channel(&channel);
    lVar11 = lVar11 + 0x90;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, double>>
  GainCalculatorDirectSpeakersImpl::_findCandidates(
      const CartesianSpeakerPosition& pos, bool isLfe, double tol) {
    Eigen::RowVector3d cartPosition = toCartesianVector3d(pos);
    std::vector<std::pair<int, double>> candidates;

    double XMin = boost::get_optional_value_or(pos.XMin, pos.X);
    double XMax = boost::get_optional_value_or(pos.XMax, pos.X);
    double YMin = boost::get_optional_value_or(pos.YMin, pos.Y);
    double YMax = boost::get_optional_value_or(pos.YMax, pos.Y);
    double ZMin = boost::get_optional_value_or(pos.ZMin, pos.Z);
    double ZMax = boost::get_optional_value_or(pos.ZMax, pos.Z);
    for (int i = 0; i < _nChannels; ++i) {
      Channel channel = _layout.channels()[i];
      if (isLfe == _isLfe[i]) {
        if (_positions.row(i)(0) + tol >= XMin &&
            _positions.row(i)(0) - tol <= XMax &&
            _positions.row(i)(1) + tol >= YMin &&
            _positions.row(i)(1) - tol <= YMax &&
            _positions.row(i)(2) + tol >= ZMin &&
            _positions.row(i)(2) - tol <= ZMax) {
          double distance = (_positions.row(i) - cartPosition).norm();
          candidates.push_back(std::make_pair(i, distance));
        }
      }
    }
    return candidates;
  }